

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Label::draw(Label *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Theme *pTVar3;
  int iVar4;
  bool bVar5;
  undefined4 in_XMM1_Da;
  undefined4 local_438;
  undefined4 local_428;
  SaveState state;
  
  pTVar3 = ((this->super_Widget).dialog)->theme;
  al_store_state(&state,0xffff);
  uVar1 = (pTVar3->fg).r;
  uVar2 = (pTVar3->fg).b;
  iVar4 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  local_438 = uVar1;
  local_428 = uVar2;
  if ((char)iVar4 != '\0') {
    local_438 = al_map_rgb(0x40,0x40,0x40);
    local_428 = in_XMM1_Da;
  }
  al_set_blender(0,1,3);
  iVar4 = (this->super_Widget).x1;
  bVar5 = this->centred == true;
  if (bVar5) {
    iVar4 = (iVar4 + (this->super_Widget).x2 + 1) / 2;
  }
  al_draw_text(local_438,local_428,(float)iVar4,(float)(this->super_Widget).y1,pTVar3->font,bVar5,
               (this->text)._M_dataplus._M_p);
  anon_unknown.dwarf_cb7c::SaveState::~SaveState(&state);
  return;
}

Assistant:

void Label::draw()
{
   const Theme & theme = this->dialog->get_theme();
   SaveState state;
   ALLEGRO_COLOR fg = theme.fg;

   if (is_disabled()) {
      fg = al_map_rgb(64, 64, 64);
   }

   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);
   if (centred) {
      al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
         this->y1, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
   }
   else {
      al_draw_text(theme.font, fg, this->x1, this->y1, 0, this->text.c_str());
   }
}